

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::CovergroupDeclarationSyntax::CovergroupDeclarationSyntax
          (CovergroupDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token covergroup,
          Token extends,Token name,FunctionPortListSyntax *portList,SyntaxNode *event,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endgroup,
          NamedBlockClauseSyntax *endBlockName)

{
  pointer ppMVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = extends._0_8_;
  uVar5 = covergroup._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,CovergroupDeclaration,attributes);
  (this->covergroup).kind = (short)uVar5;
  (this->covergroup).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->covergroup).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->covergroup).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->covergroup).info = covergroup.info;
  (this->extends).kind = (short)uVar7;
  (this->extends).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->extends).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->extends).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->extends).info = extends.info;
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  (this->name).info = name.info;
  this->portList = portList;
  this->event = event;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  uVar4 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (members->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (members->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e7db0;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar2 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e86f8;
  (this->endgroup).kind = endgroup.kind;
  (this->endgroup).field_0x2 = endgroup._2_1_;
  (this->endgroup).numFlags = (NumericTokenFlags)endgroup.numFlags.raw;
  (this->endgroup).rawLen = endgroup.rawLen;
  (this->endgroup).info = endgroup.info;
  this->endBlockName = endBlockName;
  if (portList != (FunctionPortListSyntax *)0x0) {
    (portList->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (event != (SyntaxNode *)0x0) {
    event->parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr
  ;
  sVar2 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(CovergroupDeclarationSyntax **)(*(long *)((long)ppMVar1 + lVar6) + 8) = this;
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

CovergroupDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token covergroup, Token extends, Token name, FunctionPortListSyntax* portList, SyntaxNode* event, Token semi, const SyntaxList<MemberSyntax>& members, Token endgroup, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::CovergroupDeclaration, attributes), covergroup(covergroup), extends(extends), name(name), portList(portList), event(event), semi(semi), members(members), endgroup(endgroup), endBlockName(endBlockName) {
        if (this->portList) this->portList->parent = this;
        if (this->event) this->event->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }